

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int32 dict_word2basestr(char *word)

{
  size_t sVar1;
  bool bVar2;
  int local_1c;
  int32 len;
  int32 i;
  char *word_local;
  
  sVar1 = strlen(word);
  if (word[(int)sVar1 + -1] == ')') {
    local_1c = (int)sVar1 + -2;
    while( true ) {
      bVar2 = false;
      if (0 < local_1c) {
        bVar2 = word[local_1c] != '(';
      }
      if (!bVar2) break;
      local_1c = local_1c + -1;
    }
    if (0 < local_1c) {
      word[local_1c] = '\0';
      return local_1c;
    }
  }
  return -1;
}

Assistant:

int32
dict_word2basestr(char *word)
{
    int32 i, len;

    len = strlen(word);
    if (word[len - 1] == ')') {
        for (i = len - 2; (i > 0) && (word[i] != '('); --i);

        if (i > 0) {
            /* The word is of the form <baseword>(...); strip from left-paren */
            word[i] = '\0';
            return i;
        }
    }

    return -1;
}